

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_calc_pframe_target_size_one_pass_vbr(AV1_COMP *cpi,FRAME_UPDATE_TYPE frame_update_type)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  int iVar7;
  
  uVar5 = (uint)CONCAT71(in_register_00000031,frame_update_type);
  if ((uVar5 < 4) && (uVar5 != 1)) {
    iVar3 = (cpi->ppi->p_rc).baseline_gf_interval;
    lVar2 = (long)(cpi->rc).avg_frame_bandwidth * (long)iVar3 * 10;
  }
  else {
    iVar3 = (cpi->ppi->p_rc).baseline_gf_interval;
    lVar2 = (long)(cpi->rc).avg_frame_bandwidth * (long)iVar3;
  }
  lVar2 = lVar2 / (long)(iVar3 + 9);
  iVar3 = (cpi->rc).min_frame_bandwidth;
  iVar1 = (cpi->rc).avg_frame_bandwidth;
  iVar7 = iVar1 >> 5;
  if (iVar7 < iVar3) {
    iVar7 = iVar3;
  }
  lVar4 = (long)iVar7;
  if (lVar2 < lVar4) {
    lVar2 = lVar4;
  }
  if ((frame_update_type & 0xfe) == 4) {
    lVar2 = lVar4;
  }
  lVar4 = (long)(cpi->rc).max_frame_bandwidth;
  if (lVar4 <= lVar2) {
    lVar2 = lVar4;
  }
  uVar6 = (ulong)(cpi->oxcf).rc_cfg.max_inter_bitrate_pct;
  if (uVar6 != 0) {
    lVar4 = (long)(uVar6 * (long)iVar1) / 100;
    if (lVar4 <= lVar2) {
      lVar2 = lVar4;
    }
  }
  return (int)lVar2;
}

Assistant:

int av1_calc_pframe_target_size_one_pass_vbr(
    const AV1_COMP *const cpi, FRAME_UPDATE_TYPE frame_update_type) {
  static const int af_ratio = 10;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int64_t target;
#if USE_ALTREF_FOR_ONE_PASS
  if (frame_update_type == KF_UPDATE || frame_update_type == GF_UPDATE ||
      frame_update_type == ARF_UPDATE) {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
              af_ratio) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  } else {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  }
#else
  target = rc->avg_frame_bandwidth;
#endif
  return clamp_pframe_target_size(cpi, target, frame_update_type);
}